

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O3

Vector3d * opengv::addNoise(Vector3d *__return_storage_ptr__,double noiseLevel,Vector3d *cleanPoint)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  ActualDstType actualDst;
  type lhs;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar22;
  undefined8 uVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dStack_60;
  double local_48;
  double dStack_40;
  
  auVar14 = *(undefined1 (*) [16])
             (cleanPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array;
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar11 = vandpd_avx512vl(auVar14,auVar1);
  auVar1 = vshufpd_avx(auVar14,auVar14,1);
  auVar12 = vshufps_avx(auVar11,auVar11,0x4e);
  dVar21 = auVar11._0_8_;
  dVar17 = auVar12._0_8_;
  if (dVar17 < dVar21) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (cleanPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
         .array[2];
    auVar12._8_8_ = 0x7fffffffffffffff;
    auVar12._0_8_ = 0x7fffffffffffffff;
    auVar12 = vandpd_avx512vl(auVar11,auVar12);
    if (auVar12._0_8_ < dVar21) {
      auVar3._8_8_ = 0x8000000000000000;
      auVar3._0_8_ = 0x8000000000000000;
      auVar12 = vxorpd_avx512vl(auVar1,auVar3);
      auVar13._8_8_ = 0x3ff0000000000000;
      auVar13._0_8_ = auVar12._0_8_ / auVar14._0_8_;
      uVar25 = 0;
      dVar22 = 0.0;
      goto LAB_0024d609;
    }
  }
  dVar22 = (cleanPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar22;
  if ((dVar17 <= dVar21) ||
     (auVar2._8_8_ = 0x7fffffffffffffff, auVar2._0_8_ = 0x7fffffffffffffff,
     auVar12 = vandpd_avx512vl(auVar11,auVar2), dVar17 <= auVar12._0_8_)) {
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar12 = vxorpd_avx512vl(auVar14,auVar8);
    auVar13 = ZEXT816(0x3ff0000000000000);
    uVar25 = auVar12._8_8_;
    dVar22 = auVar12._0_8_ / dVar22;
  }
  else {
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar12 = vxorpd_avx512vl(auVar11,auVar7);
    auVar23._0_8_ = auVar12._0_8_ / auVar1._0_8_;
    auVar23._8_8_ = auVar12._8_8_;
    auVar13 = vunpcklpd_avx(ZEXT816(0) << 0x40,auVar23);
    dVar22 = 1.0;
    uVar25 = 0;
  }
LAB_0024d609:
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar22 * dVar22 + auVar13._0_8_ * auVar13._0_8_ + auVar13._8_8_ * auVar13._8_8_;
  auVar12 = vsqrtpd_avx(auVar27);
  dVar17 = auVar12._0_8_;
  auVar30._8_8_ = dVar17;
  auVar30._0_8_ = dVar17;
  auVar28._0_8_ = dVar22 / dVar17;
  auVar28._8_8_ = uVar25;
  auVar12 = vdivpd_avx(auVar13,auVar30);
  auVar2 = vshufpd_avx(auVar12,auVar12,1);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar2._0_8_ * auVar11._0_8_;
  auVar13 = vfmsub231sd_fma(auVar26,auVar1,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = auVar28._0_8_ * auVar14._0_8_;
  auVar11 = vfmsub231sd_fma(auVar29,auVar12,auVar11);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar12._0_8_ * auVar1._0_8_;
  auVar2 = vfmsub231sd_fma(auVar16,auVar14,auVar2);
  auVar1 = vunpcklpd_avx(auVar13,auVar11);
  uVar9 = rand();
  iVar10 = rand();
  auVar14 = vpinsrd_avx(ZEXT416(uVar9),iVar10,1);
  auVar4._8_8_ = 0x4089000000000000;
  auVar4._0_8_ = 0x4089000000000000;
  auVar11 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (cleanPoint->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                             .m_data.array,auVar4);
  auVar14 = vcvtdq2pd_avx(auVar14);
  auVar5._8_8_ = 0x41dfffffffc00000;
  auVar5._0_8_ = 0x41dfffffffc00000;
  auVar13 = vdivpd_avx512vl(auVar14,auVar5);
  auVar14._8_8_ = 0xbfe0000000000000;
  auVar14._0_8_ = 0xbfe0000000000000;
  auVar14 = vaddpd_avx512vl(auVar13,auVar14);
  dVar17 = auVar14._0_8_ * noiseLevel;
  dVar21 = auVar14._8_8_ * noiseLevel;
  auVar18._0_8_ = dVar17 + dVar17;
  auVar18._8_8_ = dVar21 + dVar21;
  auVar6._8_8_ = 0x3ff6a0902de00d1b;
  auVar6._0_8_ = 0x3ff6a0902de00d1b;
  auVar13 = vdivpd_avx512vl(auVar18,auVar6);
  dVar17 = auVar13._0_8_;
  dStack_60 = auVar12._8_8_;
  auVar14 = vshufpd_avx(auVar13,auVar13,3);
  local_48 = auVar1._0_8_;
  dStack_40 = auVar1._8_8_;
  auVar15._0_8_ = auVar11._0_8_ + dVar17 * auVar12._0_8_ + auVar14._0_8_ * local_48;
  auVar15._8_8_ = auVar11._8_8_ + dVar17 * dStack_60 + auVar14._8_8_ * dStack_40;
  auVar14 = vunpcklpd_avx(auVar28,auVar2);
  auVar19._0_8_ = dVar17 * auVar14._0_8_;
  auVar19._8_8_ = auVar13._8_8_ * auVar14._8_8_;
  auVar14 = vshufpd_avx(auVar19,auVar19,1);
  dVar17 = (cleanPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[2] * 800.0 + auVar19._0_8_ + auVar14._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar17 * dVar17 + auVar15._0_8_ * auVar15._0_8_ + auVar15._8_8_ * auVar15._8_8_;
  auVar14 = vsqrtpd_avx(auVar20);
  dVar21 = auVar14._0_8_;
  auVar24._8_8_ = dVar21;
  auVar24._0_8_ = dVar21;
  auVar14 = vdivpd_avx(auVar15,auVar24);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar14;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar17 / dVar21;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d
opengv::addNoise( double noiseLevel, Eigen::Vector3d cleanPoint )
{
  //compute a vector in the normal plane (based on good conditioning)
  Eigen::Vector3d normalVector1;
  if(
      (fabs(cleanPoint[0]) > fabs(cleanPoint[1])) &&
      (fabs(cleanPoint[0]) > fabs(cleanPoint[2])) )
  {
    normalVector1[1] = 1.0;
    normalVector1[2] = 0.0;
    normalVector1[0] = -cleanPoint[1]/cleanPoint[0];
  }
  else
  {
    if(
        (fabs(cleanPoint[1]) > fabs(cleanPoint[0])) &&
        (fabs(cleanPoint[1]) > fabs(cleanPoint[2])) )
    {
      normalVector1[2] = 1.0;
      normalVector1[0] = 0.0;
      normalVector1[1] = -cleanPoint[2]/cleanPoint[1];
    }
    else
    {
      normalVector1[0] = 1.0;
      normalVector1[1] = 0.0;
      normalVector1[2] = -cleanPoint[0]/cleanPoint[2];
    }
  }

  normalVector1 = normalVector1 / normalVector1.norm();
  Eigen::Vector3d normalVector2 = cleanPoint.cross(normalVector1);
  double noiseX =
      noiseLevel * (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0 / 1.4142;
  double noiseY =
      noiseLevel * (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0 / 1.4142;

  Eigen::Vector3d noisyPoint =
      800 * cleanPoint + noiseX *normalVector1 + noiseY * normalVector2;
  noisyPoint = noisyPoint / noisyPoint.norm();
  return noisyPoint;

}